

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O2

void __thiscall
event_track::EventMessageInstanceBox::EventMessageInstanceBox(EventMessageInstanceBox *this)

{
  fmp4_stream::full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_0011dd38;
  *(undefined8 *)&(this->super_full_box).field_0x6c = 0;
  *(undefined8 *)((long)&this->presentation_time_delta_ + 4) = 0;
  this->id_ = 0;
  (this->scheme_id_uri_)._M_dataplus._M_p = (pointer)&(this->scheme_id_uri_).field_2;
  (this->scheme_id_uri_)._M_string_length = 0;
  (this->scheme_id_uri_).field_2._M_local_buf[0] = '\0';
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  (this->value_)._M_string_length = 0;
  (this->value_).field_2._M_local_buf[0] = '\0';
  (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

EventMessageInstanceBox()
			: reserved_(0), event_duration_(0), \
			id_(0), scheme_id_uri_(), \
			value_(), message_data_(), presentation_time_delta_(0)
		{
		}